

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O0

void write_stseg(char *dir,align_stseg_t *stseg,char *uttid,char *ctlspec)

{
  FILE *__s;
  size_t sVar1;
  char *__s_00;
  size_t sVar2;
  char *str_1;
  char *pcStack_450;
  word_posn_t wpos;
  char *str;
  uint8 pos;
  int iStack_440;
  s3cipid_t ci [3];
  int32 k;
  int32 i;
  align_stseg_t *tmp;
  FILE *fp;
  char filename [1024];
  char *ctlspec_local;
  char *uttid_local;
  align_stseg_t *stseg_local;
  char *dir_local;
  
  filename._1016_8_ = ctlspec;
  build_output_uttfile((char *)&fp,dir,uttid,ctlspec);
  strcat((char *)&fp,".stseg");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
          ,0x1a4,"Writing state segmentation to: %s\n",&fp);
  __s = fopen((char *)&fp,"wb");
  if (__s == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                   ,0x1a6,"Failed to open file %s for writing\n",&fp);
  }
  else {
    sVar1 = fwrite("0.1\n",1,4,__s);
    if (sVar1 == 4) {
      for (iStack_440 = 0; iStack_440 < kbc->mdef->n_ciphone; iStack_440 = iStack_440 + 1) {
        __s_00 = mdef_ciphone_str(kbc->mdef,(s3cipid_t)iStack_440);
        sVar1 = strlen(__s_00);
        sVar1 = fwrite(__s_00,1,sVar1,__s);
        sVar2 = strlen(__s_00);
        if ((sVar1 != sVar2) || (sVar1 = fwrite(" ",1,1,__s), sVar1 != 1)) goto LAB_0011a7ca;
      }
      pcStack_450 = "ibesu";
      sVar1 = strlen("ibesu");
      sVar1 = fwrite("ibesu",1,sVar1,__s);
      sVar2 = strlen(pcStack_450);
      if (sVar1 == sVar2) {
        pcStack_450 = "\nCI.16 LC.16 RC.16 POS.3(HI)-ST.5(LO) SCR(32)\n";
        sVar1 = strlen("\nCI.16 LC.16 RC.16 POS.3(HI)-ST.5(LO) SCR(32)\n");
        sVar1 = fwrite("\nCI.16 LC.16 RC.16 POS.3(HI)-ST.5(LO) SCR(32)\n",1,sVar1,__s);
        sVar2 = strlen(pcStack_450);
        if ((sVar1 == sVar2) && (sVar1 = fwrite("*end_comment*\n",1,0xe,__s), sVar1 == 0xe)) {
          iStack_440 = 0x11223344;
          sVar1 = fwrite(&stack0xfffffffffffffbc0,4,1,__s);
          if (sVar1 == 1) {
            iStack_440 = 0;
            for (_k = stseg; _k != (align_stseg_t *)0x0; _k = _k->next) {
              iStack_440 = iStack_440 + 1;
            }
            sVar1 = fwrite(&stack0xfffffffffffffbc0,4,1,__s);
            if (sVar1 == 1) {
              ci[1] = 0;
              ci[2] = 0;
              uttid_local = (char *)stseg;
              while( true ) {
                if (uttid_local == (char *)0x0) {
                  fclose(__s);
                  return;
                }
                mdef_phone_components
                          (kbc->mdef,*(s3pid_t *)uttid_local,(s3cipid_t *)((long)&str + 2),
                           (s3cipid_t *)((long)&str + 4),(s3cipid_t *)((long)&str + 6),
                           (word_posn_t *)((long)&str_1 + 4));
                if (7 < str_1._4_4_) {
                  __assert_fail("(wpos >= 0) && (wpos < 8)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                                ,0x1d1,"void write_stseg(char *, align_stseg_t *, char *, char *)");
                }
                if ((uttid_local[6] < '\0') || ('\x1f' < uttid_local[6])) {
                  __assert_fail("(stseg->state >= 0) && (stseg->state < 32)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                                ,0x1d2,"void write_stseg(char *, align_stseg_t *, char *, char *)");
                }
                sVar1 = fwrite((void *)((long)&str + 2),2,3,__s);
                if (sVar1 != 3) break;
                str._1_1_ = (byte)(str_1._4_4_ << 5) | uttid_local[6] & 0x1fU;
                sVar1 = fwrite((void *)((long)&str + 1),1,1,__s);
                if (sVar1 != 1) break;
                iStack_440 = *(int *)(uttid_local + 8);
                sVar1 = fwrite(&stack0xfffffffffffffbc0,4,1,__s);
                if (sVar1 != 1) break;
                ci._2_4_ = ci._2_4_ + 1;
                uttid_local = *(char **)(uttid_local + 0x10);
              }
            }
          }
        }
      }
    }
LAB_0011a7ca:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                   ,0x1e3,"Failed to write to the file %s\n",&fp);
    fclose(__s);
  }
  return;
}

Assistant:

static void
write_stseg(char *dir, align_stseg_t * stseg, char *uttid, char *ctlspec)
{
    char filename[1024];
    FILE *fp;
    align_stseg_t *tmp;
    int32 i, k;
    s3cipid_t ci[3];
    uint8 pos;
    char *str;
    word_posn_t wpos;

    build_output_uttfile(filename, dir, uttid, ctlspec);
    strcat(filename, ".stseg");
    E_INFO("Writing state segmentation to: %s\n", filename);
    if ((fp = fopen(filename, "wb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open file %s for writing\n", filename);
        return;
    }

    /* Write version no. */
    if (fwrite("0.1\n", sizeof(char), 4, fp) != 4)
        goto write_error;

    /* Write CI phone names */
    for (k = 0; k < kbc->mdef->n_ciphone; k++) {
        const char *str = mdef_ciphone_str(kbc->mdef, k);
        if (fwrite(str, sizeof(char), strlen(str), fp) != strlen(str))
            goto write_error;
        if (fwrite(" ", sizeof(char), 1, fp) != 1)
            goto write_error;
    }
    str = WPOS_NAME;
    if (fwrite(str, sizeof(char), strlen(str), fp) != strlen(str))
        goto write_error;

    /* Write format "description" */
    str = "\nCI.16 LC.16 RC.16 POS.3(HI)-ST.5(LO) SCR(32)\n";
    if (fwrite(str, sizeof(char), strlen(str), fp) != strlen(str))
        goto write_error;

    /* Write binary comment string */
    if (fwrite("*end_comment*\n", sizeof(char), 14, fp) != 14)
        goto write_error;

    /* Write byte-ordering magic number */
    k = BYTE_ORDER_MAGIC;
    if (fwrite(&k, sizeof(int32), 1, fp) != 1)
        goto write_error;

    /* Write #frames */
    for (k = 0, tmp = stseg; tmp; k++, tmp = tmp->next);
    if (fwrite(&k, sizeof(int32), 1, fp) != 1)
        goto write_error;

    /* Write state segmentation for each frame */
    for (i = 0; stseg; i++, stseg = stseg->next) {
        mdef_phone_components(kbc->mdef, stseg->pid, ci, &(ci[1]),
                              &(ci[2]), &wpos);
        assert((wpos >= 0) && (wpos < 8));
        assert((stseg->state >= 0) && (stseg->state < 32));

        if (fwrite(ci, sizeof(s3cipid_t), 3, fp) != 3)
            goto write_error;
        pos = (wpos << 5) | (stseg->state & 0x001f);
        if (fwrite(&pos, sizeof(uint8), 1, fp) != 1)
            goto write_error;

        k = stseg->score;
        if (fwrite(&k, sizeof(int32), 1, fp) != 1)
            goto write_error;
    }

    fclose(fp);
    return;

  write_error:
    E_ERROR_SYSTEM("Failed to write to the file %s\n", filename);
    fclose(fp);
}